

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextengine.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_177f1ab::Itemizer::generate
          (Itemizer *this,int start,int length,Capitalization caps)

{
  QScriptAnalysis *pQVar1;
  QScriptAnalysis QVar2;
  QList<QScriptItem> *pQVar3;
  qsizetype qVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  iterator iVar8;
  QTextBoundaryFinder *this_00;
  ulong uVar9;
  ulong uVar10;
  QScriptAnalysis *pQVar11;
  int iVar12;
  char cVar13;
  QScriptAnalysis QVar14;
  char16_t *pcVar15;
  pointer __p;
  ulong uVar16;
  long in_FS_OFFSET;
  bool bVar17;
  QStringView QVar18;
  char16_t *local_68;
  QScriptItem local_58;
  long local_38;
  
  uVar10 = (ulong)(uint)start;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (caps == MixedCase) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      generateScriptItems(this,start,length);
      return;
    }
  }
  else {
    if (caps == Capitalize) {
      if (length != 0) {
        if ((this->m_splitter)._M_t.
            super___uniq_ptr_impl<QTextBoundaryFinder,_std::default_delete<QTextBoundaryFinder>_>.
            _M_t.
            super__Tuple_impl<0UL,_QTextBoundaryFinder_*,_std::default_delete<QTextBoundaryFinder>_>
            .super__Head_base<0UL,_QTextBoundaryFinder_*,_false>._M_head_impl ==
            (QTextBoundaryFinder *)0x0) {
          pcVar15 = (this->m_string->d).ptr;
          qVar4 = (this->m_string->d).size;
          if (pcVar15 == (char16_t *)0x0) {
            pcVar15 = (char16_t *)&QString::_empty;
          }
          this_00 = (QTextBoundaryFinder *)operator_new(0x48);
          QVar18.m_data = pcVar15;
          QVar18.m_size = qVar4;
          QTextBoundaryFinder::QTextBoundaryFinder(this_00,Word,QVar18,(uchar *)0x0,0);
          local_58.position = 0;
          local_58.analysis = (QScriptAnalysis)0x0;
          std::__uniq_ptr_impl<QTextBoundaryFinder,_std::default_delete<QTextBoundaryFinder>_>::
          reset((__uniq_ptr_impl<QTextBoundaryFinder,_std::default_delete<QTextBoundaryFinder>_> *)
                &this->m_splitter,this_00);
          std::unique_ptr<QTextBoundaryFinder,_std::default_delete<QTextBoundaryFinder>_>::
          ~unique_ptr((unique_ptr<QTextBoundaryFinder,_std::default_delete<QTextBoundaryFinder>_> *)
                      &local_58);
        }
        QTextBoundaryFinder::setPosition
                  ((longlong)
                   (this->m_splitter)._M_t.
                   super___uniq_ptr_impl<QTextBoundaryFinder,_std::default_delete<QTextBoundaryFinder>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_QTextBoundaryFinder_*,_std::default_delete<QTextBoundaryFinder>_>
                   .super__Head_base<0UL,_QTextBoundaryFinder_*,_false>._M_head_impl);
        QVar2 = this->m_analysis[start];
        uVar16 = QTextBoundaryFinder::boundaryReasons();
        QVar14 = (QScriptAnalysis)((uint)QVar2 & 0xfffff0ff | 0x200);
        if ((uVar16 & 0x20) == 0) {
          QVar14 = QVar2;
        }
        QTextBoundaryFinder::toNextBoundary();
        if (1 < length) {
          iVar5 = length + start;
          uVar16 = (ulong)(start + 1);
          do {
            uVar9 = QTextBoundaryFinder::position();
            if (uVar16 == uVar9) {
              uVar7 = QTextBoundaryFinder::boundaryReasons();
              cVar13 = (char)((uVar7 & 0x20) >> 5);
              QTextBoundaryFinder::toNextBoundary();
            }
            else {
              cVar13 = '\0';
            }
            if ((((((uint)this->m_analysis[uVar16] ^ (uint)QVar14) & 0xff0fff) != 0) ||
                (0x6ff < ((uint)this->m_analysis[uVar16] & 0xf00) || cVar13 != '\0')) ||
               (0xfff < (int)uVar16 - (int)uVar10)) {
              pQVar3 = this->m_items;
              local_58.analysis = QVar14;
              local_58.position = (int)uVar10;
              local_58.num_glyphs = 0;
              local_58.descent.val = -0x40;
              local_58.ascent.val = -0x40;
              local_58.leading.val = -0x40;
              local_58.width.val = -0x40;
              local_58.glyph_data_offset = 0;
              QtPrivate::QPodArrayOps<QScriptItem>::emplace<QScriptItem>
                        ((QPodArrayOps<QScriptItem> *)pQVar3,(pQVar3->d).size,&local_58);
              QList<QScriptItem>::end(pQVar3);
              QVar14 = this->m_analysis[uVar16];
              if (cVar13 != '\0') {
                QVar14 = (QScriptAnalysis)((uint)QVar14 & 0xfffff0ff | 0x200);
              }
              uVar10 = uVar16 & 0xffffffff;
            }
            start = (int)uVar10;
            uVar16 = uVar16 + 1;
          } while ((long)uVar16 < (long)iVar5);
        }
        pQVar3 = this->m_items;
        local_58.analysis = QVar14;
        local_58.position = start;
        local_58.num_glyphs = 0;
        local_58.descent.val = -0x40;
        local_58.ascent.val = -0x40;
        local_58.leading.val = -0x40;
        local_58.width.val = -0x40;
        local_58.glyph_data_offset = 0;
        QtPrivate::QPodArrayOps<QScriptItem>::emplace<QScriptItem>
                  ((QPodArrayOps<QScriptItem> *)pQVar3,(pQVar3->d).size,&local_58);
        QList<QScriptItem>::end(pQVar3);
      }
    }
    else if (caps == SmallCaps) {
      local_68 = (this->m_string->d).ptr;
      if (local_68 == (char16_t *)0x0) {
        local_68 = (char16_t *)&QString::_empty;
      }
      if (length != 0) {
        iVar5 = QChar::category((uint)(ushort)local_68[start]);
        bVar17 = iVar5 == 0xf;
        if (1 < length) {
          bVar17 = iVar5 == 0xf;
          iVar5 = length + start;
          uVar16 = (ulong)(start + 1);
          do {
            iVar6 = QChar::category((uint)(ushort)local_68[uVar16]);
            pQVar11 = this->m_analysis;
            iVar12 = (int)uVar10;
            if ((((((uint)pQVar11[iVar12] ^ (uint)pQVar11[uVar16]) & 0xff0fff) != 0) ||
                (0x6ff < ((uint)pQVar11[uVar16] & 0xf00))) ||
               (((iVar6 == 0xf) != bVar17 || (0xfff < (int)uVar16 - iVar12)))) {
              pQVar3 = this->m_items;
              local_58.analysis = pQVar11[iVar12];
              local_58.position = iVar12;
              local_58.num_glyphs = 0;
              local_58.descent.val = -0x40;
              local_58.ascent.val = -0x40;
              local_58.leading.val = -0x40;
              local_58.width.val = -0x40;
              local_58.glyph_data_offset = 0;
              QtPrivate::QPodArrayOps<QScriptItem>::emplace<QScriptItem>
                        ((QPodArrayOps<QScriptItem> *)pQVar3,(pQVar3->d).size,&local_58);
              QList<QScriptItem>::end(pQVar3);
              if (bVar17 != false) {
                iVar8 = QList<QScriptItem>::end(this->m_items);
                iVar8.i[-1].analysis =
                     (QScriptAnalysis)((uint)iVar8.i[-1].analysis & 0xfffff0ff | 0x300);
              }
              uVar10 = uVar16 & 0xffffffff;
              bVar17 = iVar6 == 0xf;
            }
            start = (int)uVar10;
            uVar16 = uVar16 + 1;
          } while ((long)uVar16 < (long)iVar5);
        }
        pQVar3 = this->m_items;
        local_58.analysis = this->m_analysis[start];
        local_58.position = start;
        local_58.num_glyphs = 0;
        local_58.descent.val = -0x40;
        local_58.ascent.val = -0x40;
        local_58.leading.val = -0x40;
        local_58.width.val = -0x40;
        local_58.glyph_data_offset = 0;
        QtPrivate::QPodArrayOps<QScriptItem>::emplace<QScriptItem>
                  ((QPodArrayOps<QScriptItem> *)pQVar3,(pQVar3->d).size,&local_58);
        QList<QScriptItem>::end(pQVar3);
        if (bVar17 != false) {
          iVar8 = QList<QScriptItem>::end(this->m_items);
          iVar8.i[-1].analysis = (QScriptAnalysis)((uint)iVar8.i[-1].analysis & 0xfffff0ff | 0x300);
        }
      }
    }
    else {
      generateScriptItems(this,start,length);
      if ((this->m_items->d).size != 0) {
        iVar8 = QList<QScriptItem>::end(this->m_items);
        pQVar11 = &iVar8.i[-1].analysis;
        do {
          if (((uint)*pQVar11 & 0xc00) == 0) {
            *pQVar11 = (QScriptAnalysis)
                       ((uint)*pQVar11 & 0xfffff0ff | (uint)(caps != AllLowercase) * 0x100 + 0x100);
          }
          pQVar1 = pQVar11 + -1;
          pQVar11 = pQVar11 + -8;
        } while (start < (int)*pQVar1);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void generate(int start, int length, QFont::Capitalization caps)
    {
        if (caps == QFont::SmallCaps)
            generateScriptItemsSmallCaps(reinterpret_cast<const ushort *>(m_string.unicode()), start, length);
        else if (caps == QFont::Capitalize)
            generateScriptItemsCapitalize(start, length);
        else if (caps != QFont::MixedCase) {
            generateScriptItemsAndChangeCase(start, length,
                caps == QFont::AllLowercase ? QScriptAnalysis::Lowercase : QScriptAnalysis::Uppercase);
        }
        else
            generateScriptItems(start, length);
    }